

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerGraph.cpp
# Opt level: O1

void __thiscall dg::pta::PointerGraph::setEntry(PointerGraph *this,PointerSubgraph *e)

{
  *(PointerSubgraph **)(this + 8) = e;
  return;
}

Assistant:

void PointerGraph::setEntry(PointerSubgraph *e) {
#if DEBUG_ENABLED
    bool found = false;
    for (auto &n : _subgraphs) {
        if (n.get() == e) {
            found = true;
            break;
        }
    }
    assert(found && "The entry is not a subgraph of the graph");
#endif
    _entry = e;
}